

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O0

int run_test_loop_handles(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_19;
  int64_t eval_a_19;
  int64_t eval_b_18;
  int64_t eval_a_18;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  int i;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_prepare_init(uVar2,&prepare_1_handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x11e,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_prepare_start(&prepare_1_handle,0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x120,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_prepare_start(&prepare_1_handle,prepare_1_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x122,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_check_init(uVar2,&check_handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x125,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_check_start(&check_handle,check_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x127,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_prepare_init(uVar2,&prepare_2_handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,299,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  for (eval_a._4_4_ = 0; eval_a._4_4_ < 7; eval_a._4_4_ = eval_a._4_4_ + 1) {
    uVar2 = uv_default_loop();
    iVar1 = uv_idle_init(uVar2,idle_1_handles + eval_a._4_4_);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
              ,0x130,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&timer_handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x138,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start(&timer_handle,timer_cb,100);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x13a,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_unref(&timer_handle);
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x13e,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)loop_iteration != 0x15) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x140,"loop_iteration","==","21",(long)loop_iteration,"==",0x15);
    abort();
  }
  if ((long)prepare_1_cb_called != 0x15) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x142,"prepare_1_cb_called","==","21",(long)prepare_1_cb_called,"==",0x15);
    abort();
  }
  if ((long)prepare_1_close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x143,"1","==","prepare_1_close_cb_called",1,"==",(long)prepare_1_close_cb_called);
    abort();
  }
  if ((long)prepare_2_cb_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x145,"prepare_2_cb_called","==","21 / 2",(long)prepare_2_cb_called,"==",10);
    abort();
  }
  if ((long)prepare_2_close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x146,"1","==","prepare_2_close_cb_called",1,"==",(long)prepare_2_close_cb_called);
    abort();
  }
  if ((long)check_cb_called != 0x15) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x148,"check_cb_called","==","21",(long)check_cb_called,"==",0x15);
    abort();
  }
  if ((long)check_close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x149,"1","==","check_close_cb_called",1,"==",(long)check_close_cb_called);
    abort();
  }
  if ((long)idle_1_close_cb_called != 7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x14c,"idle_1_close_cb_called","==","7",(long)idle_1_close_cb_called,"==",7);
    abort();
  }
  if ((long)idle_2_close_cb_called != (long)idle_2_cb_started) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x14e,"idle_2_close_cb_called","==","idle_2_cb_started",(long)idle_2_close_cb_called,
            "==",(long)idle_2_cb_started);
    abort();
  }
  if ((long)idle_2_is_active != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x14f,"idle_2_is_active","==","0",(long)idle_2_is_active,"==",0);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x151,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(loop_handles) {
  int i;
  int r;

  r = uv_prepare_init(uv_default_loop(), &prepare_1_handle);
  ASSERT_OK(r);
  r = uv_prepare_start(&prepare_1_handle, NULL);
  ASSERT(r == UV_EINVAL);
  r = uv_prepare_start(&prepare_1_handle, prepare_1_cb);
  ASSERT_OK(r);

  r = uv_check_init(uv_default_loop(), &check_handle);
  ASSERT_OK(r);
  r = uv_check_start(&check_handle, check_cb);
  ASSERT_OK(r);

  /* initialize only, prepare_2 is started by prepare_1_cb */
  r = uv_prepare_init(uv_default_loop(), &prepare_2_handle);
  ASSERT_OK(r);

  for (i = 0; i < IDLE_COUNT; i++) {
    /* initialize only, idle_1 handles are started by check_cb */
    r = uv_idle_init(uv_default_loop(), &idle_1_handles[i]);
    ASSERT_OK(r);
  }

  /* don't init or start idle_2, both is done by idle_1_cb */

  /* The timer callback is there to keep the event loop polling unref it as it
   * is not supposed to keep the loop alive */
  r = uv_timer_init(uv_default_loop(), &timer_handle);
  ASSERT_OK(r);
  r = uv_timer_start(&timer_handle, timer_cb, TIMEOUT, TIMEOUT);
  ASSERT_OK(r);
  uv_unref((uv_handle_t*)&timer_handle);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(loop_iteration, ITERATIONS);

  ASSERT_EQ(prepare_1_cb_called, ITERATIONS);
  ASSERT_EQ(1, prepare_1_close_cb_called);

  ASSERT_EQ(prepare_2_cb_called, ITERATIONS / 2);
  ASSERT_EQ(1, prepare_2_close_cb_called);

  ASSERT_EQ(check_cb_called, ITERATIONS);
  ASSERT_EQ(1, check_close_cb_called);

  /* idle_1_cb should be called a lot */
  ASSERT_EQ(idle_1_close_cb_called, IDLE_COUNT);

  ASSERT_EQ(idle_2_close_cb_called, idle_2_cb_started);
  ASSERT_OK(idle_2_is_active);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}